

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

void __thiscall ON_wString::Destroy(ON_wString *this)

{
  ON_Internal_Empty_wString *memblock;
  wchar_t *pwVar1;
  
  pwVar1 = this->m_s;
  memblock = (ON_Internal_Empty_wString *)(pwVar1 + -3);
  if ((memblock != &empty_wstring && pwVar1 != (wchar_t *)0x0) &&
     (0 < (memblock->header).ref_count.super___atomic_base<int>._M_i)) {
    LOCK();
    (memblock->header).ref_count.super___atomic_base<int>._M_i =
         (memblock->header).ref_count.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((memblock->header).ref_count.super___atomic_base<int>._M_i == 0) {
      pwVar1[-2] = L'\0';
      pwVar1[-1] = L'\0';
      onfree(memblock);
    }
  }
  this->m_s = (wchar_t *)0x8431fc;
  return;
}

Assistant:

void ON_wString::Destroy()
{
  ON_wStringHeader* hdr = Header();
  if ( hdr != pEmptyStringHeader && nullptr != hdr && (int)(hdr->ref_count) > 0 )
    ON_wStringHeader_DecrementRefCountAndDeleteIfZero(hdr);
	Create();
}